

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ProceduralBlockSyntax *pPVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  __fn *args;
  
  args_1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack;
  args = __fn;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x58aed4);
  deepClone<slang::syntax::StatementSyntax>((StatementSyntax *)__fn,(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     (unaff_retaddr,(SyntaxKind *)args,args_1,(Token *)TVar2.info,TVar2._0_8_);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ProceduralBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ProceduralBlockSyntax>(
        node.kind,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}